

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

int parse_args_DEFI(Context *ctx)

{
  uint32 *puVar1;
  
  parse_destination_token(ctx,&ctx->dest_arg);
  if ((ctx->dest_arg).regtype != REG_TYPE_CONSTINT) {
    failf(ctx,"%s","DEFI using non-CONSTING register");
  }
  if ((ctx->dest_arg).relative != 0) {
    failf(ctx,"%s","relative addressing in DEFI");
  }
  puVar1 = ctx->tokens;
  ctx->dwords[0] = *puVar1;
  ctx->dwords[1] = puVar1[1];
  ctx->dwords[2] = puVar1[2];
  ctx->dwords[3] = puVar1[3];
  return 6;
}

Assistant:

static int parse_args_DEFI(Context *ctx)
{
    parse_destination_token(ctx, &ctx->dest_arg);
    if (ctx->dest_arg.regtype != REG_TYPE_CONSTINT)
        fail(ctx, "DEFI using non-CONSTING register");
    if (ctx->dest_arg.relative)  // I'm pretty sure this is illegal...?
        fail(ctx, "relative addressing in DEFI");

    ctx->dwords[0] = SWAP32(ctx->tokens[0]);
    ctx->dwords[1] = SWAP32(ctx->tokens[1]);
    ctx->dwords[2] = SWAP32(ctx->tokens[2]);
    ctx->dwords[3] = SWAP32(ctx->tokens[3]);

    return 6;
}